

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye_model.hpp
# Opt level: O0

void __thiscall
FisheyeModel::calibrate
          (FisheyeModel *this,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,Size *image_size,Size *board_size,Size *square_size,int flags,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detected_image_list,string *model_filename)

{
  double dVar1;
  TermCriteria TVar2;
  ostream *poVar3;
  allocator local_221;
  string local_220 [32];
  double local_200;
  double _avg_reproj_error;
  vector<double,_std::allocator<double>_> image_reproj_errors;
  double dStack_1d8;
  _OutputArray local_1d0;
  _OutputArray local_1b8;
  _InputOutputArray local_1a0;
  _InputOutputArray local_188;
  _InputArray local_170;
  _InputArray local_148;
  double local_130;
  double avg_reproj_error;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tvecs;
  vector<cv::Mat,_std::allocator<cv::Mat>_> rvecs;
  Mat distort_coeffs;
  Mat camera_matrix;
  Size *square_size_local;
  Size *board_size_local;
  Size *image_size_local;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *image_points_list_local;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  *object_points_list_local;
  FisheyeModel *this_local;
  
  cv::Mat::Mat((Mat *)(distort_coeffs.step.buf + 1));
  cv::Mat::Mat((Mat *)&rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
             &tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&avg_reproj_error);
  cv::_InputArray::_InputArray<cv::Point3_<float>>(&local_148,object_points_list);
  cv::_InputArray::_InputArray<cv::Point_<float>>(&local_170,image_points_list);
  cv::_InputOutputArray::_InputOutputArray(&local_188,(Mat *)(distort_coeffs.step.buf + 1));
  cv::_InputOutputArray::_InputOutputArray
            (&local_1a0,
             (Mat *)&rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::_OutputArray
            (&local_1b8,
             (vector<cv::Mat,_std::allocator<cv::Mat>_> *)
             &tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::_OutputArray
            (&local_1d0,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)&avg_reproj_error);
  cv::TermCriteria::TermCriteria
            ((TermCriteria *)
             &image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,3,200,0.0001);
  TVar2.epsilon = dStack_1d8;
  TVar2._0_8_ = image_reproj_errors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  dVar1 = (double)cv::fisheye::calibrate
                            (&local_148,&local_170,(Size_ *)image_size,&local_188,&local_1a0,
                             &local_1b8,&local_1d0,flags,TVar2);
  cv::_OutputArray::~_OutputArray(&local_1d0);
  cv::_OutputArray::~_OutputArray(&local_1b8);
  cv::_InputOutputArray::~_InputOutputArray(&local_1a0);
  cv::_InputOutputArray::~_InputOutputArray(&local_188);
  cv::_InputArray::~_InputArray(&local_170);
  cv::_InputArray::~_InputArray(&local_148);
  local_130 = dVar1;
  poVar3 = std::operator<<((ostream *)&std::cout,"=== Root Mean Square Error ===\n");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_130);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"=== Camera Matrix ===\n");
  poVar3 = cv::operator<<(poVar3,(Mat *)(distort_coeffs.step.buf + 1));
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"=== Distance Coefficients ===\n");
  poVar3 = cv::operator<<(poVar3,(Mat *)&rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar3,"\n");
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&_avg_reproj_error);
  local_200 = computeReprojectionErrors
                        (this,object_points_list,image_points_list,
                         (vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                         &tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (vector<cv::Mat,_std::allocator<cv::Mat>_> *)&avg_reproj_error,
                         (Mat *)(distort_coeffs.step.buf + 1),
                         (Mat *)&rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,
                         (vector<double,_std::allocator<double>_> *)&_avg_reproj_error);
  poVar3 = std::operator<<((ostream *)&std::cout,"=== Recalculted Root Mean Square Error ===\n");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_200);
  std::operator<<(poVar3,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"fisheye_model",&local_221);
  BaseModel::saveParamsToXML
            (&this->super_BaseModel,(string *)local_220,(Mat *)(distort_coeffs.step.buf + 1),0.0,
             (Mat *)&rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,flags,local_130,image_size,board_size
             ,square_size,detected_image_list,image_points_list,
             (vector<cv::Mat,_std::allocator<cv::Mat>_> *)
             &tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cv::Mat,_std::allocator<cv::Mat>_> *)&avg_reproj_error,
             (vector<double,_std::allocator<double>_> *)&_avg_reproj_error,model_filename);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  BaseModel::loadParamsFromXML(&this->super_BaseModel,model_filename);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&_avg_reproj_error);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&avg_reproj_error);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
             &tvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)&rvecs.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)(distort_coeffs.step.buf + 1));
  return;
}

Assistant:

void calibrate(
    const std::vector<std::vector<cv::Point3f>>& object_points_list,
    const std::vector<std::vector<cv::Point2f>>& image_points_list,
    const cv::Size& image_size,
    const cv::Size& board_size,
    const cv::Size& square_size,
    const int flags,
    const std::vector<std::string>& detected_image_list,
    const std::string& model_filename
  ) {
    cv::Mat camera_matrix, distort_coeffs;
    std::vector<cv::Mat> rvecs, tvecs;
    
    double avg_reproj_error = cv::fisheye::calibrate(
      object_points_list,
      image_points_list,
      image_size,
      camera_matrix,
      distort_coeffs,
      rvecs,
      tvecs,
      flags,
      cv::TermCriteria(cv::TermCriteria::COUNT+cv::TermCriteria::EPS, 200, 0.0001)
    );
    std::cout << "=== Root Mean Square Error ===\n" << avg_reproj_error << "\n";
    std::cout << "=== Camera Matrix ===\n" << camera_matrix << "\n";
    std::cout << "=== Distance Coefficients ===\n" << distort_coeffs << "\n";

    std::vector<double> image_reproj_errors;
    double _avg_reproj_error = this->computeReprojectionErrors(
      object_points_list,
      image_points_list,
      rvecs,
      tvecs,
      camera_matrix,
      distort_coeffs,
      image_reproj_errors
    );
    std::cout << "=== Recalculted Root Mean Square Error ===\n" << _avg_reproj_error << "\n";

    this->saveParamsToXML(
      "fisheye_model",
      camera_matrix,
      0,
      distort_coeffs,
      flags,
      avg_reproj_error,
      image_size,
      board_size,
      square_size,
      detected_image_list,
      image_points_list,
      rvecs,
      tvecs,
      image_reproj_errors,
      model_filename
    );
    
    this->loadParamsFromXML(model_filename);
  }